

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf.c
# Opt level: O1

uint fl_utf8toa(char *src,uint srclen,char *dst,uint dstlen)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  uint uVar5;
  uint uVar6;
  byte *end;
  wchar_t len_1;
  wchar_t len;
  wchar_t local_38;
  wchar_t local_34;
  
  end = (byte *)(src + srclen);
  if (dstlen == 0) {
    uVar6 = 0;
  }
  else {
    uVar6 = 0;
    pcVar4 = dst;
    do {
      iVar2 = 1;
      if (src < end) {
        if ((byte)*src < 0xc2) {
          dst[uVar6] = *src;
          src = (char *)((byte *)src + 1);
        }
        else {
          uVar5 = fl_utf8decode(src,(char *)end,&local_34);
          pcVar4 = (char *)((ulong)pcVar4 & 0xffffffff);
          src = (char *)((byte *)src + local_34);
          cVar1 = (char)uVar5;
          if (0xff < uVar5) {
            cVar1 = '?';
          }
          dst[uVar6] = cVar1;
        }
        uVar5 = uVar6 + 1;
        iVar2 = 2;
        iVar3 = 0;
        if (dstlen <= uVar5) goto LAB_001feb58;
      }
      else {
        pcVar4 = (char *)(ulong)uVar6;
        uVar5 = uVar6;
LAB_001feb58:
        dst[uVar6] = '\0';
        iVar3 = iVar2;
      }
      uVar6 = uVar5;
    } while (iVar3 == 0);
    if (iVar3 != 2) {
      return (uint)pcVar4;
    }
  }
  if (src < end) {
    do {
      if (*src < '\0') {
        fl_utf8decode(src,(char *)end,&local_38);
        src = (char *)((byte *)src + local_38);
      }
      else {
        src = (char *)((byte *)src + 1);
      }
      uVar6 = uVar6 + 1;
    } while (src < end);
  }
  return uVar6;
}

Assistant:

unsigned fl_utf8toa(const char* src, unsigned srclen,
		 char* dst, unsigned dstlen)
{
  const char* p = src;
  const char* e = src+srclen;
  unsigned count = 0;
  if (dstlen) for (;;) {
    unsigned char c;
    if (p >= e) {dst[count] = 0; return count;}
    c = *(const unsigned char*)p;
    if (c < 0xC2) { /* ascii or bad code */
      dst[count] = c;
      p++;
    } else {
      int len; unsigned ucs = fl_utf8decode(p,e,&len);
      p += len;
      if (ucs < 0x100) dst[count] = ucs;
      else dst[count] = '?';
    }
    if (++count >= dstlen) {dst[count-1] = 0; break;}
  }
  /* we filled dst, measure the rest: */
  while (p < e) {
    if (!(*p & 0x80)) p++;
    else {
      int len;
      fl_utf8decode(p,e,&len);
      p += len;
    }
    ++count;
  }
  return count;
}